

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdin(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  uv_process_options_t *puVar4;
  int extraout_EDX;
  long *plVar5;
  long *plVar6;
  undefined1 **ppuVar7;
  int64_t eval_b_1;
  int64_t eval_a_1;
  uv_buf_t buf;
  char buffer [23];
  uv_stdio_container_t stdio [2];
  uv_write_t write_req;
  uv_pipe_t in;
  uv_pipe_t out;
  undefined1 *puStack_648;
  uv_process_options_t *puStack_640;
  undefined8 uStack_638;
  code *pcStack_630;
  long lStack_628;
  long lStack_620;
  uv_process_options_t *puStack_618;
  long lStack_608;
  long lStack_600;
  uv_process_options_t *puStack_5f8;
  uv_process_options_t *puStack_5f0;
  long lStack_5e0;
  long lStack_5d8;
  undefined4 uStack_5cc;
  uv_stdio_container_t uStack_5c8;
  undefined4 uStack_5b8;
  undefined4 uStack_5b0;
  undefined4 uStack_5a8;
  undefined4 uStack_5a0;
  undefined4 uStack_598;
  undefined4 uStack_590;
  undefined1 auStack_588 [16];
  uv_process_options_t *puStack_578;
  undefined8 uStack_570;
  long lStack_568;
  undefined1 auStack_560 [208];
  code *pcStack_490;
  long lStack_488;
  long lStack_480;
  uv_stdio_container_t uStack_478;
  undefined4 uStack_468;
  undefined4 uStack_458;
  undefined4 uStack_448;
  uv_process_options_t *puStack_440;
  uv_process_options_t auStack_430 [2];
  undefined1 *puStack_348;
  anon_union_8_2_13e1ed65_for_data aStack_340;
  long local_318;
  long local_310;
  char *local_308;
  undefined8 local_300;
  char local_2f8 [32];
  uv_stdio_container_t local_2d8;
  undefined4 local_2c8;
  undefined1 *local_2c0;
  long local_2b0 [25];
  undefined1 local_1e8 [232];
  undefined1 local_100 [232];
  
  builtin_strncpy(local_2f8,"hello-from-spawn_stdin",0x17);
  init_process_options("spawn_helper3",exit_cb);
  uVar2 = uv_default_loop();
  puVar3 = local_100;
  uv_pipe_init(uVar2,puVar3,0);
  uVar2 = uv_default_loop();
  uv_pipe_init(uVar2,(uv_stream_t *)local_1e8,0);
  options.stdio = &local_2d8;
  local_2d8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_2c8 = 0x21;
  options.stdio_count = 2;
  local_2d8.data.stream = (uv_stream_t *)local_1e8;
  local_2c0 = puVar3;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  local_2b0[0] = (long)iVar1;
  local_308 = (char *)0x0;
  if (local_2b0[0] == 0) {
    local_308 = local_2f8;
    local_300 = 0x17;
    iVar1 = uv_write(local_2b0,local_1e8,&local_308,1,write_cb);
    local_310 = (long)iVar1;
    local_318 = 0;
    if (local_310 != 0) goto LAB_001c0251;
    iVar1 = uv_read_start(local_100,on_alloc,on_read);
    local_310 = (long)iVar1;
    local_318 = 0;
    if (local_310 != 0) goto LAB_001c025e;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    local_310 = (long)iVar1;
    local_318 = 0;
    if (local_310 != 0) goto LAB_001c026b;
    local_310 = 1;
    local_318 = (long)exit_cb_called;
    if (local_318 != 1) goto LAB_001c0278;
    local_310 = 3;
    local_318 = (long)close_cb_called;
    if (local_318 != 3) goto LAB_001c0285;
    iVar1 = strcmp(local_2f8,output);
    local_310 = (long)iVar1;
    local_318 = 0;
    if (local_310 != 0) goto LAB_001c0292;
    puVar3 = (undefined1 *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    uv_run(puVar3,0);
    local_310 = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    local_318 = (long)iVar1;
    if (local_310 == local_318) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdin_cold_1();
LAB_001c0251:
    run_test_spawn_stdin_cold_2();
LAB_001c025e:
    run_test_spawn_stdin_cold_3();
LAB_001c026b:
    run_test_spawn_stdin_cold_4();
LAB_001c0278:
    run_test_spawn_stdin_cold_5();
LAB_001c0285:
    run_test_spawn_stdin_cold_6();
LAB_001c0292:
    run_test_spawn_stdin_cold_7();
  }
  iVar1 = (int)&local_318;
  plVar5 = &local_310;
  run_test_spawn_stdin_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_close(plVar5[0xb],close_cb);
    return iVar1;
  }
  write_cb_cold_1();
  pcStack_490 = (code *)0x1c030e;
  puStack_348 = puVar3;
  aStack_340.stream = (uv_stream_t *)local_1e8;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_490 = (code *)0x1c0313;
  uVar2 = uv_default_loop();
  puVar4 = auStack_430;
  pcStack_490 = (code *)0x1c0327;
  uv_pipe_init(uVar2,puVar4,0);
  options.stdio = &uStack_478;
  uStack_478.flags = UV_IGNORE;
  uStack_468 = 0;
  uStack_458 = 0;
  uStack_448 = 0x21;
  options.stdio_count = 4;
  pcStack_490 = (code *)0x1c035c;
  puStack_440 = puVar4;
  uVar2 = uv_default_loop();
  pcStack_490 = (code *)0x1c036e;
  iVar1 = uv_spawn(uVar2,&process,&options);
  lStack_480 = (long)iVar1;
  lStack_488 = 0;
  if (lStack_480 == 0) {
    pcStack_490 = (code *)0x1c03a4;
    iVar1 = uv_read_start(auStack_430,on_alloc,on_read);
    lStack_480 = (long)iVar1;
    lStack_488 = 0;
    if (lStack_480 != 0) goto LAB_001c04e4;
    pcStack_490 = (code *)0x1c03c7;
    uVar2 = uv_default_loop();
    pcStack_490 = (code *)0x1c03d1;
    iVar1 = uv_run(uVar2,0);
    lStack_480 = (long)iVar1;
    lStack_488 = 0;
    if (lStack_480 != 0) goto LAB_001c04f1;
    lStack_480 = 1;
    lStack_488 = (long)exit_cb_called;
    if (lStack_488 != 1) goto LAB_001c04fe;
    lStack_480 = 2;
    lStack_488 = (long)close_cb_called;
    if (lStack_488 != 2) goto LAB_001c050b;
    pcStack_490 = (code *)0x1c044d;
    printf("output from stdio[3] is: %s",output);
    pcStack_490 = (code *)0x1c045c;
    iVar1 = strcmp("fourth stdio!\n",output);
    lStack_480 = (long)iVar1;
    lStack_488 = 0;
    puVar4 = (uv_process_options_t *)output;
    if (lStack_480 != 0) goto LAB_001c0518;
    pcStack_490 = (code *)0x1c047f;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    pcStack_490 = (code *)0x1c0493;
    uv_walk(puVar4,close_walk_cb,0);
    pcStack_490 = (code *)0x1c049d;
    uv_run(puVar4,0);
    lStack_480 = 0;
    pcStack_490 = (code *)0x1c04ab;
    uVar2 = uv_default_loop();
    pcStack_490 = (code *)0x1c04b3;
    iVar1 = uv_loop_close(uVar2);
    lStack_488 = (long)iVar1;
    if (lStack_480 == lStack_488) {
      pcStack_490 = (code *)0x1c04c9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_490 = (code *)0x1c04e4;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001c04e4:
    pcStack_490 = (code *)0x1c04f1;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001c04f1:
    pcStack_490 = (code *)0x1c04fe;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001c04fe:
    pcStack_490 = (code *)0x1c050b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001c050b:
    pcStack_490 = (code *)0x1c0518;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001c0518:
    pcStack_490 = (code *)0x1c0525;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_490 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStack_578 = (uv_process_options_t *)0x1c053e;
  uVar2 = uv_default_loop();
  puStack_578 = (uv_process_options_t *)0x1c054b;
  iVar1 = uv_tcp_init(uVar2,auStack_560);
  lStack_568 = (long)iVar1;
  uStack_570 = 0;
  if (lStack_568 == 0) {
    puStack_578 = (uv_process_options_t *)0x1c0574;
    iVar1 = uv_tcp_open(auStack_560,3);
    lStack_568 = (long)iVar1;
    uStack_570 = 0;
    if (lStack_568 != 0) goto LAB_001c05d3;
    puStack_578 = (uv_process_options_t *)0x1c059f;
    iVar1 = uv_listen(auStack_560,0x1000,0);
    lStack_568 = (long)iVar1;
    uStack_570 = 0;
    if (lStack_568 == 0) {
      return 1;
    }
  }
  else {
    puStack_578 = (uv_process_options_t *)0x1c05d3;
    spawn_tcp_server_helper_cold_1();
LAB_001c05d3:
    puStack_578 = (uv_process_options_t *)0x1c05e0;
    spawn_tcp_server_helper_cold_2();
  }
  puStack_578 = (uv_process_options_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStack_5f0 = (uv_process_options_t *)0x1c0605;
  puStack_578 = puVar4;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStack_5f0 = (uv_process_options_t *)0x1c061b;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_588);
  uStack_5c8._0_8_ = SEXT48(iVar1);
  lStack_5e0 = 0;
  if (uStack_5c8._0_8_ == 0) {
    puStack_5f0 = (uv_process_options_t *)0x1c0640;
    uVar2 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1c0654;
    iVar1 = uv_tcp_init_ex(uVar2,&tcp_server,2);
    uStack_5c8._0_8_ = SEXT48(iVar1);
    lStack_5e0 = 0;
    if (uStack_5c8._0_8_ != 0) goto LAB_001c0839;
    puStack_5f0 = (uv_process_options_t *)0x1c0687;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_588,0);
    uStack_5c8._0_8_ = SEXT48(iVar1);
    lStack_5e0 = 0;
    if (uStack_5c8._0_8_ != 0) goto LAB_001c0848;
    puStack_5f0 = (uv_process_options_t *)0x1c06b8;
    iVar1 = uv_fileno(&tcp_server,&uStack_5cc);
    uStack_5c8._0_8_ = SEXT48(iVar1);
    lStack_5e0 = 0;
    if (uStack_5c8._0_8_ != 0) goto LAB_001c0857;
    options.stdio = &uStack_5c8;
    puVar4 = &options;
    uStack_5c8._4_4_ = iVar1 >> 0x1f;
    uStack_5c8.flags = 2;
    uStack_5c8.data.file = 0;
    uStack_5b8 = 2;
    uStack_5b0 = 1;
    uStack_5a8 = 2;
    uStack_5a0 = 2;
    uStack_598 = 2;
    uStack_590 = uStack_5cc;
    options.stdio_count = 4;
    puStack_5f0 = (uv_process_options_t *)0x1c0722;
    uVar2 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1c0734;
    iVar1 = uv_spawn(uVar2,&process,&options);
    lStack_5e0 = (long)iVar1;
    lStack_5d8 = 0;
    if (lStack_5e0 != 0) goto LAB_001c0866;
    puStack_5f0 = (uv_process_options_t *)0x1c0759;
    uVar2 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1c0763;
    iVar1 = uv_run(uVar2,0);
    lStack_5e0 = (long)iVar1;
    lStack_5d8 = 0;
    if (lStack_5e0 != 0) goto LAB_001c0875;
    lStack_5e0 = 1;
    lStack_5d8 = (long)exit_cb_called;
    if (lStack_5d8 != 1) goto LAB_001c0884;
    lStack_5e0 = 1;
    lStack_5d8 = (long)close_cb_called;
    if (lStack_5d8 != 1) goto LAB_001c0893;
    puStack_5f0 = (uv_process_options_t *)0x1c07d2;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1c07e6;
    uv_walk(puVar4,close_walk_cb,0);
    puStack_5f0 = (uv_process_options_t *)0x1c07f0;
    uv_run(puVar4,0);
    lStack_5e0 = 0;
    puStack_5f0 = (uv_process_options_t *)0x1c07fe;
    uVar2 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1c0806;
    iVar1 = uv_loop_close(uVar2);
    lStack_5d8 = (long)iVar1;
    if (lStack_5e0 == lStack_5d8) {
      puStack_5f0 = (uv_process_options_t *)0x1c0822;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_5f0 = (uv_process_options_t *)0x1c0839;
    run_test_spawn_tcp_server_cold_1();
LAB_001c0839:
    puStack_5f0 = (uv_process_options_t *)0x1c0848;
    run_test_spawn_tcp_server_cold_2();
LAB_001c0848:
    puStack_5f0 = (uv_process_options_t *)0x1c0857;
    run_test_spawn_tcp_server_cold_3();
LAB_001c0857:
    puStack_5f0 = (uv_process_options_t *)0x1c0866;
    run_test_spawn_tcp_server_cold_4();
LAB_001c0866:
    puStack_5f0 = (uv_process_options_t *)0x1c0875;
    run_test_spawn_tcp_server_cold_5();
LAB_001c0875:
    puStack_5f0 = (uv_process_options_t *)0x1c0884;
    run_test_spawn_tcp_server_cold_6();
LAB_001c0884:
    puStack_5f0 = (uv_process_options_t *)0x1c0893;
    run_test_spawn_tcp_server_cold_7();
LAB_001c0893:
    puStack_5f0 = (uv_process_options_t *)0x1c08a2;
    run_test_spawn_tcp_server_cold_8();
  }
  puStack_5f0 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStack_5f0 = &options;
  puStack_618 = (uv_process_options_t *)0x1c08cb;
  puStack_5f8 = puVar4;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar4 = &options;
  options.stdio_count = 0;
  puStack_618 = (uv_process_options_t *)0x1c08eb;
  uVar2 = uv_default_loop();
  puStack_618 = (uv_process_options_t *)0x1c08fd;
  iVar1 = uv_spawn(uVar2,&process,&options);
  lStack_600 = (long)iVar1;
  lStack_608 = 0;
  if (lStack_600 == 0) {
    puStack_618 = (uv_process_options_t *)0x1c091e;
    uVar2 = uv_default_loop();
    puStack_618 = (uv_process_options_t *)0x1c0928;
    iVar1 = uv_run(uVar2,0);
    lStack_600 = (long)iVar1;
    lStack_608 = 0;
    if (lStack_600 != 0) goto LAB_001c09fc;
    lStack_600 = 1;
    lStack_608 = (long)exit_cb_called;
    if (lStack_608 != 1) goto LAB_001c0a0b;
    lStack_600 = 1;
    lStack_608 = (long)close_cb_called;
    if (lStack_608 != 1) goto LAB_001c0a1a;
    puStack_618 = (uv_process_options_t *)0x1c0997;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    puStack_618 = (uv_process_options_t *)0x1c09ab;
    uv_walk(puVar4,close_walk_cb,0);
    puStack_618 = (uv_process_options_t *)0x1c09b5;
    uv_run(puVar4,0);
    lStack_600 = 0;
    puStack_618 = (uv_process_options_t *)0x1c09c3;
    uVar2 = uv_default_loop();
    puStack_618 = (uv_process_options_t *)0x1c09cb;
    iVar1 = uv_loop_close(uVar2);
    lStack_608 = (long)iVar1;
    if (lStack_600 == lStack_608) {
      puStack_618 = (uv_process_options_t *)0x1c09e3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_618 = (uv_process_options_t *)0x1c09fc;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001c09fc:
    puStack_618 = (uv_process_options_t *)0x1c0a0b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001c0a0b:
    puStack_618 = (uv_process_options_t *)0x1c0a1a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001c0a1a:
    puStack_618 = (uv_process_options_t *)0x1c0a29;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStack_618 = (uv_process_options_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  plVar5 = &lStack_628;
  pcStack_630 = (code *)0x1c0a50;
  puStack_618 = puVar4;
  init_process_options("spawn_helper4",kill_cb);
  pcStack_630 = (code *)0x1c0a55;
  uVar2 = uv_default_loop();
  pcStack_630 = (code *)0x1c0a6b;
  iVar1 = uv_spawn(uVar2,&process,&options);
  lStack_620 = (long)iVar1;
  lStack_628 = 0;
  if (lStack_620 == 0) {
    pcStack_630 = (code *)0x1c0a8e;
    uVar2 = uv_default_loop();
    pcStack_630 = (code *)0x1c0a9d;
    iVar1 = uv_timer_init(uVar2,&timer);
    lStack_620 = (long)iVar1;
    lStack_628 = 0;
    if (lStack_620 != 0) goto LAB_001c0bca;
    pcStack_630 = (code *)0x1c0ad5;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    lStack_620 = (long)iVar1;
    lStack_628 = 0;
    if (lStack_620 != 0) goto LAB_001c0bd7;
    pcStack_630 = (code *)0x1c0af8;
    uVar2 = uv_default_loop();
    pcStack_630 = (code *)0x1c0b02;
    iVar1 = uv_run(uVar2,0);
    lStack_620 = (long)iVar1;
    lStack_628 = 0;
    if (lStack_620 != 0) goto LAB_001c0be4;
    lStack_620 = 1;
    lStack_628 = (long)exit_cb_called;
    if (lStack_628 != 1) goto LAB_001c0bf1;
    lStack_620 = 2;
    lStack_628 = (long)close_cb_called;
    if (lStack_628 != 2) goto LAB_001c0bfe;
    pcStack_630 = (code *)0x1c0b6b;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    pcStack_630 = (code *)0x1c0b7f;
    uv_walk(puVar4,close_walk_cb,0);
    pcStack_630 = (code *)0x1c0b89;
    uv_run(puVar4,0);
    lStack_620 = 0;
    pcStack_630 = (code *)0x1c0b97;
    uVar2 = uv_default_loop();
    pcStack_630 = (code *)0x1c0b9f;
    iVar1 = uv_loop_close(uVar2);
    lStack_628 = (long)iVar1;
    if (lStack_620 == lStack_628) {
      pcStack_630 = (code *)0x1c0bb5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_630 = (code *)0x1c0bca;
    run_test_spawn_and_kill_cold_1();
LAB_001c0bca:
    pcStack_630 = (code *)0x1c0bd7;
    run_test_spawn_and_kill_cold_2();
LAB_001c0bd7:
    pcStack_630 = (code *)0x1c0be4;
    run_test_spawn_and_kill_cold_3();
LAB_001c0be4:
    pcStack_630 = (code *)0x1c0bf1;
    run_test_spawn_and_kill_cold_4();
LAB_001c0bf1:
    pcStack_630 = (code *)0x1c0bfe;
    run_test_spawn_and_kill_cold_5();
LAB_001c0bfe:
    pcStack_630 = (code *)0x1c0c0b;
    run_test_spawn_and_kill_cold_6();
  }
  plVar6 = &lStack_620;
  pcStack_630 = kill_cb;
  run_test_spawn_and_kill_cold_7();
  pcStack_630 = (code *)0x0;
  uStack_638 = 0;
  puStack_640 = puVar4;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  puStack_648 = (undefined1 *)plVar5;
  if (plVar5 == (long *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001c0cb9;
    uv_close(plVar6,close_cb);
    puStack_648 = (undefined1 *)(long)(int)plVar6[9];
    if (puStack_648 != (undefined1 *)0x0) {
      iVar1 = uv_kill(puStack_648,0);
      puStack_648 = (undefined1 *)(long)iVar1;
      if (puStack_648 == (undefined1 *)0xfffffffffffffffd) {
        return iVar1;
      }
      goto LAB_001c0ccb;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001c0cb9:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001c0ccb:
  ppuVar7 = &puStack_648;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar1 = uv_close(ppuVar7,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_stdin) {
  int r;
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  char buffer[] = "hello-from-spawn_stdin";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  buf.base = buffer;
  buf.len = sizeof(buffer);
  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called); /* Once for process twice for the pipe. */
  ASSERT_OK(strcmp(buffer, output));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}